

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,int N_,int val)

{
  ulong uVar1;
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize(&this->bits,(long)N_);
  if (0 < this->N) {
    uVar1 = 0;
    do {
      (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1].value =
           (byte)((uint)val >> ((byte)uVar1 & 0x1f)) & uVar1 < 0x20;
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)this->N);
  }
  return;
}

Assistant:

quad_value_bit_vector(const int N_, const int val) : N(N_) {
      //bits.resize(NUM_BYTES(N));
      bits.resize(N);

      for (int i = 0; i < N; i++) {
        if (i < ((int) sizeof(int)*8)) {
          set(i, quad_value((val >> i) & 0x01));
        } else {
          set(i, quad_value(0));
        }
      }
    }